

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ziparchive.cpp
# Opt level: O0

void __thiscall
ZipArchive::addFile(ZipArchive *this,string *fileName,bool store,uint64_t compSize,
                   uint64_t uncompSize,time_t ts,uint32_t crc,uint16_t flags)

{
  undefined1 local_98 [8];
  ZipEntry ze;
  time_t ts_local;
  uint64_t uncompSize_local;
  uint64_t compSize_local;
  bool store_local;
  string *fileName_local;
  ZipArchive *this_local;
  
  ze._88_8_ = ts;
  ZipEntry::ZipEntry((ZipEntry *)local_98);
  std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::operator=
            ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)&ze.store,
             (nullptr_t)0x0);
  std::__cxx11::string::operator=((string *)local_98,(string *)fileName);
  ze.crc = ze.gid;
  ze._68_4_ = ze._92_4_;
  ze.originalSize._0_4_ = crc;
  ze.timeStamp._0_2_ = flags;
  ze.flags = 0;
  ze._82_2_ = 0;
  ze.timeStamp._4_4_ = 0;
  ze.name.field_2._M_local_buf[8] = store;
  ze.data._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
  super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
       (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
       (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)compSize;
  ze.dataSize = uncompSize;
  add(this,(ZipEntry *)local_98);
  ZipEntry::~ZipEntry((ZipEntry *)local_98);
  return;
}

Assistant:

void ZipArchive::addFile(const std::string& fileName, bool store,
                         uint64_t compSize, uint64_t uncompSize, time_t ts,
                         uint32_t crc, uint16_t flags)
{
    ZipEntry ze;
    ze.data = nullptr;
    ze.name = fileName;
    ze.store = store;
    ze.dataSize = compSize;
    ze.originalSize = uncompSize;
    ze.timeStamp = ts;
    ze.crc = crc;
    ze.flags = flags;
    ze.gid = 0;
    ze.uid = 0;
    add(ze);
}